

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

void __thiscall
boost::python::
class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
::
def_impl<LFPConsumer,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(LFPConsumer::*)()const,boost::python::detail::def_helper<char_const*,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
          (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
           *this,LFPConsumer *param_1,char *name,first_type fn,
          def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
          *helper,...)

{
  undefined8 *in_R9;
  vector2<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_LFPConsumer_&>
  local_29;
  object_base local_28;
  
  make_function<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(LFPConsumer::*)()const,boost::python::default_call_policies,boost::python::detail::keywords<0ul>,boost::mpl::vector2<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,LFPConsumer&>>
            ((first_type)&local_28,(default_call_policies *)fn,(keywords<0UL> *)helper,&local_29);
  objects::add_to_namespace((object *)this,name,(object *)&local_28,*(char **)*in_R9);
  api::object_base::~object_base(&local_28);
  return;
}

Assistant:

inline void def_impl(
        T*
      , char const* name
      , Fn fn
      , Helper const& helper
      , ...
    )
    {
        objects::add_to_namespace(
            *this
          , name
          , make_function(
                fn
              , helper.policies()
              , helper.keywords()
              , detail::get_signature(fn, (T*)0)
            )
          , helper.doc()
        );

        this->def_default(name, fn, helper, mpl::bool_<Helper::has_default_implementation>());
    }